

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::parse_msgpack_internal
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  char_int_type cVar3;
  string *context;
  string last_token;
  uint32_t len_3;
  uint16_t len_2;
  uint32_t len_1;
  uint16_t len;
  int64_t number_9;
  int32_t number_8;
  int16_t number_7;
  int8_t number_6;
  uint64_t number_5;
  uint32_t number_4;
  uint16_t number_3;
  uint8_t number_2;
  double number_1;
  float number;
  binary_t b;
  string_t s;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffffd98;
  undefined1 *puVar4;
  json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  double *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  input_format_t format;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffffdb8;
  bool local_235;
  bool local_234;
  bool local_233;
  bool local_232;
  bool local_231;
  undefined1 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd1;
  undefined1 in_stack_fffffffffffffdd2;
  undefined1 in_stack_fffffffffffffdd3;
  undefined1 in_stack_fffffffffffffdd4;
  undefined1 in_stack_fffffffffffffdd5;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffffdd8;
  bool local_20a;
  bool local_1eb;
  bool local_1e9;
  bool local_1d9;
  string *in_stack_fffffffffffffe48;
  input_format_t in_stack_fffffffffffffe54;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffffe58;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [16];
  string_t *in_stack_fffffffffffffeb0;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec8;
  input_format_t in_stack_fffffffffffffed4;
  binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *in_stack_fffffffffffffed8;
  string local_118 [32];
  undefined4 local_f8;
  undefined2 local_f2;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  undefined2 in_stack_ffffffffffffff16;
  string *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff28;
  int id_;
  allocator local_c1;
  string local_c0 [32];
  undefined8 local_a0;
  byte local_93;
  byte local_92;
  allocator local_91;
  string local_90 [36];
  undefined4 local_6c;
  string local_30 [47];
  bool local_1;
  
  id_ = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  format = (input_format_t)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  cVar3 = get((binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<const_char_*>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  context = (string *)(ulong)(cVar3 + 1);
  switch(context) {
  case (string *)0x0:
    local_1 = unexpect_eof(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                           in_stack_fffffffffffffec8);
    break;
  case (string *)0x1:
  case (string *)0x2:
  case (string *)0x3:
  case (string *)0x4:
  case (string *)0x5:
  case (string *)0x6:
  case (string *)0x7:
  case (string *)0x8:
  case (string *)0x9:
  case (string *)0xa:
  case (string *)0xb:
  case (string *)0xc:
  case (string *)0xd:
  case (string *)0xe:
  case (string *)0xf:
  case (string *)0x10:
  case (string *)0x11:
  case (string *)0x12:
  case (string *)0x13:
  case (string *)0x14:
  case (string *)0x15:
  case (string *)0x16:
  case (string *)0x17:
  case (string *)0x18:
  case (string *)0x19:
  case (string *)0x1a:
  case (string *)0x1b:
  case (string *)0x1c:
  case (string *)0x1d:
  case (string *)0x1e:
  case (string *)0x1f:
  case (string *)0x20:
  case (string *)0x21:
  case (string *)0x22:
  case (string *)0x23:
  case (string *)0x24:
  case (string *)0x25:
  case (string *)0x26:
  case (string *)0x27:
  case (string *)0x28:
  case (string *)0x29:
  case (string *)0x2a:
  case (string *)0x2b:
  case (string *)0x2c:
  case (string *)0x2d:
  case (string *)0x2e:
  case (string *)0x2f:
  case (string *)0x30:
  case (string *)0x31:
  case (string *)0x32:
  case (string *)0x33:
  case (string *)0x34:
  case (string *)0x35:
  case (string *)0x36:
  case (string *)0x37:
  case (string *)0x38:
  case (string *)0x39:
  case (string *)0x3a:
  case (string *)0x3b:
  case (string *)0x3c:
  case (string *)0x3d:
  case (string *)0x3e:
  case (string *)0x3f:
  case (string *)0x40:
  case (string *)0x41:
  case (string *)0x42:
  case (string *)0x43:
  case (string *)0x44:
  case (string *)0x45:
  case (string *)0x46:
  case (string *)0x47:
  case (string *)0x48:
  case (string *)0x49:
  case (string *)0x4a:
  case (string *)0x4b:
  case (string *)0x4c:
  case (string *)0x4d:
  case (string *)0x4e:
  case (string *)0x4f:
  case (string *)0x50:
  case (string *)0x51:
  case (string *)0x52:
  case (string *)0x53:
  case (string *)0x54:
  case (string *)0x55:
  case (string *)0x56:
  case (string *)0x57:
  case (string *)0x58:
  case (string *)0x59:
  case (string *)0x5a:
  case (string *)0x5b:
  case (string *)0x5c:
  case (string *)0x5d:
  case (string *)0x5e:
  case (string *)0x5f:
  case (string *)0x60:
  case (string *)0x61:
  case (string *)0x62:
  case (string *)0x63:
  case (string *)0x64:
  case (string *)0x65:
  case (string *)0x66:
  case (string *)0x67:
  case (string *)0x68:
  case (string *)0x69:
  case (string *)0x6a:
  case (string *)0x6b:
  case (string *)0x6c:
  case (string *)0x6d:
  case (string *)0x6e:
  case (string *)0x6f:
  case (string *)0x70:
  case (string *)0x71:
  case (string *)0x72:
  case (string *)0x73:
  case (string *)0x74:
  case (string *)0x75:
  case (string *)0x76:
  case (string *)0x77:
  case (string *)0x78:
  case (string *)0x79:
  case (string *)0x7a:
  case (string *)0x7b:
  case (string *)0x7c:
  case (string *)0x7d:
  case (string *)0x7e:
  case (string *)0x7f:
  case (string *)0x80:
    local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::number_unsigned((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    break;
  case (string *)0x81:
  case (string *)0x82:
  case (string *)0x83:
  case (string *)0x84:
  case (string *)0x85:
  case (string *)0x86:
  case (string *)0x87:
  case (string *)0x88:
  case (string *)0x89:
  case (string *)0x8a:
  case (string *)0x8b:
  case (string *)0x8c:
  case (string *)0x8d:
  case (string *)0x8e:
  case (string *)0x8f:
  case (string *)0x90:
    local_1 = get_msgpack_object(in_stack_fffffffffffffdd8,
                                 CONCAT17(in_stack_fffffffffffffdd7,
                                          CONCAT16(in_stack_fffffffffffffdd6,
                                                   CONCAT15(in_stack_fffffffffffffdd5,
                                                            CONCAT14(in_stack_fffffffffffffdd4,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffdd3,
                                                  CONCAT12(in_stack_fffffffffffffdd2,
                                                           CONCAT11(in_stack_fffffffffffffdd1,
                                                                    in_stack_fffffffffffffdd0)))))))
                                );
    break;
  case (string *)0x91:
  case (string *)0x92:
  case (string *)0x93:
  case (string *)0x94:
  case (string *)0x95:
  case (string *)0x96:
  case (string *)0x97:
  case (string *)0x98:
  case (string *)0x99:
  case (string *)0x9a:
  case (string *)0x9b:
  case (string *)0x9c:
  case (string *)0x9d:
  case (string *)0x9e:
  case (string *)0x9f:
  case (string *)0xa0:
    local_1 = get_msgpack_array(in_stack_fffffffffffffd98,
                                CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    break;
  case (string *)0xa1:
  case (string *)0xa2:
  case (string *)0xa3:
  case (string *)0xa4:
  case (string *)0xa5:
  case (string *)0xa6:
  case (string *)0xa7:
  case (string *)0xa8:
  case (string *)0xa9:
  case (string *)0xaa:
  case (string *)0xab:
  case (string *)0xac:
  case (string *)0xad:
  case (string *)0xae:
  case (string *)0xaf:
  case (string *)0xb0:
  case (string *)0xb1:
  case (string *)0xb2:
  case (string *)0xb3:
  case (string *)0xb4:
  case (string *)0xb5:
  case (string *)0xb6:
  case (string *)0xb7:
  case (string *)0xb8:
  case (string *)0xb9:
  case (string *)0xba:
  case (string *)0xbb:
  case (string *)0xbc:
  case (string *)0xbd:
  case (string *)0xbe:
  case (string *)0xbf:
  case (string *)0xc0:
  case (string *)0xda:
  case (string *)0xdb:
  case (string *)0xdc:
    std::__cxx11::string::string(local_30);
    bVar1 = get_msgpack_string(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    local_1d9 = false;
    if (bVar1) {
      local_1d9 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::string((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                           (string_t *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88)
                          );
    }
    local_1 = local_1d9;
    std::__cxx11::string::~string(local_30);
    break;
  case (string *)0xc1:
    local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::null((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    break;
  default:
    get_token_string(in_stack_fffffffffffffdd8);
    std::operator+((char *)in_stack_fffffffffffffdd8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdd7,
                            CONCAT16(in_stack_fffffffffffffdd6,
                                     CONCAT15(in_stack_fffffffffffffdd5,
                                              CONCAT14(in_stack_fffffffffffffdd4,
                                                       CONCAT13(in_stack_fffffffffffffdd3,
                                                                CONCAT12(in_stack_fffffffffffffdd2,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffdd1,
                                                  in_stack_fffffffffffffdd0))))))));
    this_00 = (json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)&stack0xfffffffffffffe5f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"value",(allocator *)this_00);
    exception_message(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                      context);
    puVar4 = &stack0xfffffffffffffe48;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                 (nullptr_t)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    parse_error::
    create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (id_,CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)))
               ,in_stack_ffffffffffffff18,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT26(in_stack_ffffffffffffff16,
                           CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)));
    uVar2 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::parse_error<nlohmann::detail::parse_error>
                      (this_00,(size_t)puVar4,
                       (string *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                       (parse_error *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88))
    ;
    local_1 = (bool)uVar2;
    parse_error::~parse_error((parse_error *)0xe05ef5);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)CONCAT17(uVar2,in_stack_fffffffffffffd90));
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe5f);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_118);
    break;
  case (string *)0xc3:
    local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::boolean((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                        (bool)in_stack_fffffffffffffd8f);
    break;
  case (string *)0xc4:
    local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::boolean((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                        (bool)in_stack_fffffffffffffd8f);
    break;
  case (string *)0xc5:
  case (string *)0xc6:
  case (string *)0xc7:
  case (string *)0xc8:
  case (string *)0xc9:
  case (string *)0xca:
  case (string *)0xd5:
  case (string *)0xd6:
  case (string *)0xd7:
  case (string *)0xd8:
  case (string *)0xd9:
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    bVar1 = get_msgpack_binary(in_stack_fffffffffffffdd8,
                               (binary_t *)
                               CONCAT17(in_stack_fffffffffffffdd7,
                                        CONCAT16(in_stack_fffffffffffffdd6,
                                                 CONCAT15(in_stack_fffffffffffffdd5,
                                                          CONCAT14(in_stack_fffffffffffffdd4,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffdd3,
                                                  CONCAT12(in_stack_fffffffffffffdd2,
                                                           CONCAT11(in_stack_fffffffffffffdd1,
                                                                    in_stack_fffffffffffffdd0)))))))
                              );
    local_1e9 = false;
    if (bVar1) {
      local_1e9 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::binary((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                           (binary_t *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88)
                          );
    }
    local_1 = local_1e9;
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    ~byte_container_with_subtype
              ((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0xe055e8);
    break;
  case (string *)0xcb:
    local_6c = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<float,false>
                      (in_stack_fffffffffffffdb8,format,(float *)in_stack_fffffffffffffda8);
    local_92 = 0;
    local_93 = 0;
    local_1eb = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_92 = 1;
      std::__cxx11::string::string(local_90,"",&local_91);
      local_93 = 1;
      local_1eb = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::number_float((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                 (number_float_t)
                                 CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                                 (string_t *)0xe056dd);
    }
    local_1 = local_1eb;
    if ((local_93 & 1) != 0) {
      std::__cxx11::string::~string(local_90);
    }
    if ((local_92 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
    break;
  case (string *)0xcc:
    local_a0 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<double,false>(in_stack_fffffffffffffdb8,format,in_stack_fffffffffffffda8);
    local_20a = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"",&local_c1);
      local_20a = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::number_float((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                 (number_float_t)
                                 CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                                 (string_t *)0xe05857);
    }
    local_1 = local_20a;
    if (bVar1) {
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
    break;
  case (string *)0xcd:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_char,false>
                      (in_stack_fffffffffffffdb8,format,(uchar *)in_stack_fffffffffffffda8);
    local_1 = false;
    if (bVar1) {
      local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::number_unsigned((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                  CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    }
    break;
  case (string *)0xce:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_short,false>
                      (in_stack_fffffffffffffdb8,format,(unsigned_short *)in_stack_fffffffffffffda8)
    ;
    local_1 = false;
    if (bVar1) {
      local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::number_unsigned((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                  CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    }
    break;
  case (string *)0xcf:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_int,false>
                      (in_stack_fffffffffffffdb8,format,(uint *)in_stack_fffffffffffffda8);
    local_1 = false;
    if (bVar1) {
      local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::number_unsigned((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                  CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    }
    break;
  case (string *)0xd0:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_long,false>
                      (in_stack_fffffffffffffdb8,format,(unsigned_long *)in_stack_fffffffffffffda8);
    local_1 = false;
    if (bVar1) {
      local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::number_unsigned((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                  CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    }
    break;
  case (string *)0xd1:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<signed_char,false>
                      (in_stack_fffffffffffffdb8,format,(char *)in_stack_fffffffffffffda8);
    local_1 = false;
    if (bVar1) {
      local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::number_integer((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                 CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    }
    break;
  case (string *)0xd2:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<short,false>
                      (in_stack_fffffffffffffdb8,format,(short *)in_stack_fffffffffffffda8);
    local_1 = false;
    if (bVar1) {
      local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::number_integer((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                 CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    }
    break;
  case (string *)0xd3:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<int,false>
                      (in_stack_fffffffffffffdb8,format,(int *)in_stack_fffffffffffffda8);
    local_1 = false;
    if (bVar1) {
      local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::number_integer((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                 CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    }
    break;
  case (string *)0xd4:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<long,false>
                      (in_stack_fffffffffffffdb8,format,(long *)in_stack_fffffffffffffda8);
    local_231 = false;
    if (bVar1) {
      local_231 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::number_integer((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                                   CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    }
    local_1 = local_231;
    break;
  case (string *)0xdd:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_short,false>
                      (in_stack_fffffffffffffdb8,format,(unsigned_short *)in_stack_fffffffffffffda8)
    ;
    local_232 = false;
    if (bVar1) {
      local_232 = get_msgpack_array(in_stack_fffffffffffffd98,
                                    CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    }
    local_1 = local_232;
    break;
  case (string *)0xde:
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_int,false>
                      (in_stack_fffffffffffffdb8,format,(uint *)in_stack_fffffffffffffda8);
    local_233 = false;
    if (bVar1) {
      local_233 = get_msgpack_array(in_stack_fffffffffffffd98,
                                    CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    }
    local_1 = local_233;
    break;
  case (string *)0xdf:
    local_f2 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_short,false>
                      (in_stack_fffffffffffffdb8,format,(unsigned_short *)in_stack_fffffffffffffda8)
    ;
    local_234 = false;
    if (bVar1) {
      local_234 = get_msgpack_object(in_stack_fffffffffffffdd8,
                                     CONCAT17(in_stack_fffffffffffffdd7,
                                              CONCAT16(in_stack_fffffffffffffdd6,
                                                       CONCAT15(in_stack_fffffffffffffdd5,
                                                                CONCAT14(in_stack_fffffffffffffdd4,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffdd3,
                                                  CONCAT12(in_stack_fffffffffffffdd2,
                                                           CONCAT11(in_stack_fffffffffffffdd1,
                                                                    in_stack_fffffffffffffdd0)))))))
                                    );
    }
    local_1 = local_234;
    break;
  case (string *)0xe0:
    local_f8 = 0;
    bVar1 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<char_const*>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ::get_number<unsigned_int,false>
                      (in_stack_fffffffffffffdb8,format,(uint *)in_stack_fffffffffffffda8);
    local_235 = false;
    if (bVar1) {
      local_235 = get_msgpack_object(in_stack_fffffffffffffdd8,
                                     CONCAT17(in_stack_fffffffffffffdd7,
                                              CONCAT16(in_stack_fffffffffffffdd6,
                                                       CONCAT15(in_stack_fffffffffffffdd5,
                                                                CONCAT14(in_stack_fffffffffffffdd4,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffdd3,
                                                  CONCAT12(in_stack_fffffffffffffdd2,
                                                           CONCAT11(in_stack_fffffffffffffdd1,
                                                                    in_stack_fffffffffffffdd0)))))))
                                    );
    }
    local_1 = local_235;
    break;
  case (string *)0xe1:
  case (string *)0xe2:
  case (string *)0xe3:
  case (string *)0xe4:
  case (string *)0xe5:
  case (string *)0xe6:
  case (string *)0xe7:
  case (string *)0xe8:
  case (string *)0xe9:
  case (string *)0xea:
  case (string *)0xeb:
  case (string *)0xec:
  case (string *)0xed:
  case (string *)0xee:
  case (string *)0xef:
  case (string *)0xf0:
  case (string *)0xf1:
  case (string *)0xf2:
  case (string *)0xf3:
  case (string *)0xf4:
  case (string *)0xf5:
  case (string *)0xf6:
  case (string *)0xf7:
  case (string *)0xf8:
  case (string *)0xf9:
  case (string *)0xfa:
  case (string *)0xfb:
  case (string *)0xfc:
  case (string *)0xfd:
  case (string *)0xfe:
  case (string *)0xff:
  case (string *)0x100:
    local_1 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::number_integer((json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                               CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool parse_msgpack_internal()
    {
        switch (get())
        {
            // EOF
            case std::char_traits<char_type>::eof():
                return unexpect_eof(input_format_t::msgpack, "value");

            // positive fixint
            case 0x00:
            case 0x01:
            case 0x02:
            case 0x03:
            case 0x04:
            case 0x05:
            case 0x06:
            case 0x07:
            case 0x08:
            case 0x09:
            case 0x0A:
            case 0x0B:
            case 0x0C:
            case 0x0D:
            case 0x0E:
            case 0x0F:
            case 0x10:
            case 0x11:
            case 0x12:
            case 0x13:
            case 0x14:
            case 0x15:
            case 0x16:
            case 0x17:
            case 0x18:
            case 0x19:
            case 0x1A:
            case 0x1B:
            case 0x1C:
            case 0x1D:
            case 0x1E:
            case 0x1F:
            case 0x20:
            case 0x21:
            case 0x22:
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x26:
            case 0x27:
            case 0x28:
            case 0x29:
            case 0x2A:
            case 0x2B:
            case 0x2C:
            case 0x2D:
            case 0x2E:
            case 0x2F:
            case 0x30:
            case 0x31:
            case 0x32:
            case 0x33:
            case 0x34:
            case 0x35:
            case 0x36:
            case 0x37:
            case 0x38:
            case 0x39:
            case 0x3A:
            case 0x3B:
            case 0x3C:
            case 0x3D:
            case 0x3E:
            case 0x3F:
            case 0x40:
            case 0x41:
            case 0x42:
            case 0x43:
            case 0x44:
            case 0x45:
            case 0x46:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4A:
            case 0x4B:
            case 0x4C:
            case 0x4D:
            case 0x4E:
            case 0x4F:
            case 0x50:
            case 0x51:
            case 0x52:
            case 0x53:
            case 0x54:
            case 0x55:
            case 0x56:
            case 0x57:
            case 0x58:
            case 0x59:
            case 0x5A:
            case 0x5B:
            case 0x5C:
            case 0x5D:
            case 0x5E:
            case 0x5F:
            case 0x60:
            case 0x61:
            case 0x62:
            case 0x63:
            case 0x64:
            case 0x65:
            case 0x66:
            case 0x67:
            case 0x68:
            case 0x69:
            case 0x6A:
            case 0x6B:
            case 0x6C:
            case 0x6D:
            case 0x6E:
            case 0x6F:
            case 0x70:
            case 0x71:
            case 0x72:
            case 0x73:
            case 0x74:
            case 0x75:
            case 0x76:
            case 0x77:
            case 0x78:
            case 0x79:
            case 0x7A:
            case 0x7B:
            case 0x7C:
            case 0x7D:
            case 0x7E:
            case 0x7F:
                return sax->number_unsigned(static_cast<number_unsigned_t>(current));

            // fixmap
            case 0x80:
            case 0x81:
            case 0x82:
            case 0x83:
            case 0x84:
            case 0x85:
            case 0x86:
            case 0x87:
            case 0x88:
            case 0x89:
            case 0x8A:
            case 0x8B:
            case 0x8C:
            case 0x8D:
            case 0x8E:
            case 0x8F:
                return get_msgpack_object(static_cast<std::size_t>(static_cast<unsigned int>(current) & 0x0Fu));

            // fixarray
            case 0x90:
            case 0x91:
            case 0x92:
            case 0x93:
            case 0x94:
            case 0x95:
            case 0x96:
            case 0x97:
            case 0x98:
            case 0x99:
            case 0x9A:
            case 0x9B:
            case 0x9C:
            case 0x9D:
            case 0x9E:
            case 0x9F:
                return get_msgpack_array(static_cast<std::size_t>(static_cast<unsigned int>(current) & 0x0Fu));

            // fixstr
            case 0xA0:
            case 0xA1:
            case 0xA2:
            case 0xA3:
            case 0xA4:
            case 0xA5:
            case 0xA6:
            case 0xA7:
            case 0xA8:
            case 0xA9:
            case 0xAA:
            case 0xAB:
            case 0xAC:
            case 0xAD:
            case 0xAE:
            case 0xAF:
            case 0xB0:
            case 0xB1:
            case 0xB2:
            case 0xB3:
            case 0xB4:
            case 0xB5:
            case 0xB6:
            case 0xB7:
            case 0xB8:
            case 0xB9:
            case 0xBA:
            case 0xBB:
            case 0xBC:
            case 0xBD:
            case 0xBE:
            case 0xBF:
            case 0xD9: // str 8
            case 0xDA: // str 16
            case 0xDB: // str 32
            {
                string_t s;
                return get_msgpack_string(s) && sax->string(s);
            }

            case 0xC0: // nil
                return sax->null();

            case 0xC2: // false
                return sax->boolean(false);

            case 0xC3: // true
                return sax->boolean(true);

            case 0xC4: // bin 8
            case 0xC5: // bin 16
            case 0xC6: // bin 32
            case 0xC7: // ext 8
            case 0xC8: // ext 16
            case 0xC9: // ext 32
            case 0xD4: // fixext 1
            case 0xD5: // fixext 2
            case 0xD6: // fixext 4
            case 0xD7: // fixext 8
            case 0xD8: // fixext 16
            {
                binary_t b;
                return get_msgpack_binary(b) && sax->binary(b);
            }

            case 0xCA: // float 32
            {
                float number{};
                return get_number(input_format_t::msgpack, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 0xCB: // float 64
            {
                double number{};
                return get_number(input_format_t::msgpack, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 0xCC: // uint 8
            {
                std::uint8_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_unsigned(number);
            }

            case 0xCD: // uint 16
            {
                std::uint16_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_unsigned(number);
            }

            case 0xCE: // uint 32
            {
                std::uint32_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_unsigned(number);
            }

            case 0xCF: // uint 64
            {
                std::uint64_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_unsigned(number);
            }

            case 0xD0: // int 8
            {
                std::int8_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_integer(number);
            }

            case 0xD1: // int 16
            {
                std::int16_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_integer(number);
            }

            case 0xD2: // int 32
            {
                std::int32_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_integer(number);
            }

            case 0xD3: // int 64
            {
                std::int64_t number{};
                return get_number(input_format_t::msgpack, number) && sax->number_integer(number);
            }

            case 0xDC: // array 16
            {
                std::uint16_t len{};
                return get_number(input_format_t::msgpack, len) && get_msgpack_array(static_cast<std::size_t>(len));
            }

            case 0xDD: // array 32
            {
                std::uint32_t len{};
                return get_number(input_format_t::msgpack, len) && get_msgpack_array(static_cast<std::size_t>(len));
            }

            case 0xDE: // map 16
            {
                std::uint16_t len{};
                return get_number(input_format_t::msgpack, len) && get_msgpack_object(static_cast<std::size_t>(len));
            }

            case 0xDF: // map 32
            {
                std::uint32_t len{};
                return get_number(input_format_t::msgpack, len) && get_msgpack_object(static_cast<std::size_t>(len));
            }

            // negative fixint
            case 0xE0:
            case 0xE1:
            case 0xE2:
            case 0xE3:
            case 0xE4:
            case 0xE5:
            case 0xE6:
            case 0xE7:
            case 0xE8:
            case 0xE9:
            case 0xEA:
            case 0xEB:
            case 0xEC:
            case 0xED:
            case 0xEE:
            case 0xEF:
            case 0xF0:
            case 0xF1:
            case 0xF2:
            case 0xF3:
            case 0xF4:
            case 0xF5:
            case 0xF6:
            case 0xF7:
            case 0xF8:
            case 0xF9:
            case 0xFA:
            case 0xFB:
            case 0xFC:
            case 0xFD:
            case 0xFE:
            case 0xFF:
                return sax->number_integer(static_cast<std::int8_t>(current));

            default: // anything else
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read, exception_message(input_format_t::msgpack, "invalid byte: 0x" + last_token, "value"), BasicJsonType()));
            }
        }
    }